

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O0

int x25519_get_priv_raw(EVP_PKEY *pkey,uint8_t *out,size_t *out_len)

{
  X25519_KEY *key;
  size_t *out_len_local;
  uint8_t *out_local;
  EVP_PKEY *pkey_local;
  
  if (*(char *)((long)pkey->pkey + 0x40) == '\0') {
    ERR_put_error(6,0,0x82,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                  ,0x4c);
    pkey_local._4_4_ = 0;
  }
  else if (out == (uint8_t *)0x0) {
    *out_len = 0x20;
    pkey_local._4_4_ = 1;
  }
  else if (*out_len < 0x20) {
    ERR_put_error(6,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                  ,0x56);
    pkey_local._4_4_ = 0;
  }
  else {
    OPENSSL_memcpy(out,(void *)((long)pkey->pkey + 0x20),0x20);
    *out_len = 0x20;
    pkey_local._4_4_ = 1;
  }
  return pkey_local._4_4_;
}

Assistant:

static int x25519_get_priv_raw(const EVP_PKEY *pkey, uint8_t *out,
                               size_t *out_len) {
  const X25519_KEY *key = reinterpret_cast<X25519_KEY *>(pkey->pkey);
  if (!key->has_private) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NOT_A_PRIVATE_KEY);
    return 0;
  }

  if (out == NULL) {
    *out_len = 32;
    return 1;
  }

  if (*out_len < 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  OPENSSL_memcpy(out, key->priv, 32);
  *out_len = 32;
  return 1;
}